

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcoll.cpp
# Opt level: O0

int __thiscall
CVmObjCollection::const_get_coll_prop
          (CVmObjCollection *this,vm_prop_id_t prop,vm_val_t *retval,vm_val_t *self_val,
          vm_obj_id_t *src_obj,uint *argc)

{
  CVmMetaTable *pCVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RCX;
  long *plVar4;
  undefined8 in_RDX;
  CVmMetaTable *in_RDI;
  undefined4 *in_R8;
  undefined8 in_R9;
  uint func_idx;
  code *local_68;
  uint local_4;
  
  *in_R8 = 0;
  pCVar1 = G_meta_table_X;
  CVmMetaclass::get_reg_idx(metaclass_reg_);
  uVar2 = CVmMetaTable::prop_to_vector_idx
                    (in_RDI,(uint)((ulong)pCVar1 >> 0x20),(vm_prop_id_t)((ulong)pCVar1 >> 0x10));
  local_68 = (code *)func_table_[(ulong)uVar2 * 2];
  plVar4 = (long *)((long)&in_RDI->table_ + func_table_[(ulong)uVar2 * 2 + 1]);
  if (((ulong)local_68 & 1) != 0) {
    local_68 = *(code **)(local_68 + *plVar4 + -1);
  }
  iVar3 = (*local_68)(plVar4,in_RDX,in_RCX,in_R9);
  local_4 = (uint)(iVar3 != 0);
  return local_4;
}

Assistant:

int CVmObjCollection::const_get_coll_prop(VMG_ vm_prop_id_t prop,
                                          vm_val_t *retval,
                                          const vm_val_t *self_val,
                                          vm_obj_id_t *src_obj,
                                          uint *argc)
{
    uint func_idx;

    /* presume no source object */
    *src_obj = VM_INVALID_OBJ;

    /* translate the property index to an index into our function table */
    func_idx = G_meta_table
               ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);

    /* call the appropriate function */
    if ((this->*func_table_[func_idx])(vmg_ retval, self_val, argc))
        return TRUE;

    /* not found */
    return FALSE;
}